

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O3

int32_t icu_63::GreekUpper::toUpper
                  (uint32_t options,UChar *dest,int32_t destCapacity,UChar *src,int32_t srcLength,
                  Edits *edits,UErrorCode *errorCode)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  UBool UVar4;
  uint uVar5;
  uint32_t uVar6;
  int32_t result;
  uint32_t uVar7;
  int32_t iVar8;
  ulong uVar9;
  byte bVar10;
  UChar *pUVar11;
  int iVar12;
  int unchangedLength;
  int iVar13;
  int i;
  ulong uVar14;
  uint uVar16;
  bool bVar17;
  bool bVar18;
  UChar *s;
  ulong uVar15;
  
  if (srcLength < 1) {
LAB_002ccf4e:
    iVar8 = 0;
  }
  else {
    uVar9 = 0;
    bVar10 = 0;
    iVar13 = 0;
    bVar1 = false;
    do {
      iVar12 = iVar13 + 1;
      uVar16 = (uint)(ushort)src[iVar13];
      i = iVar12;
      if ((((uVar16 & 0xfc00) == 0xd800) && (iVar12 != srcLength)) &&
         (((ushort)src[iVar12] & 0xfc00) == 0xdc00)) {
        uVar16 = (uint)(ushort)src[iVar13] * 0x400 + (uint)(ushort)src[iVar12] + 0xfca02400;
        i = iVar13 + 2;
      }
      uVar5 = ucase_getTypeOrIgnorable_63(uVar16);
      bVar18 = uVar5 != 0;
      bVar3 = uVar5 != 0;
      if ((uVar5 & 4) != 0) {
        bVar18 = (bool)(bVar10 & 1);
        bVar3 = bVar1;
      }
      uVar6 = getLetterData(uVar16);
      iVar8 = (int32_t)uVar9;
      if (uVar6 == 0) {
        result = ucase_toFullUpper_63(uVar16,(UCaseContextIterator *)0x0,(void *)0x0,&s,4);
        uVar16 = anon_unknown_10::appendResult
                           (dest,iVar8,destCapacity,result,s,i - iVar13,options,edits);
        uVar9 = (ulong)uVar16;
        bVar10 = bVar18;
joined_r0x002ccc78:
        iVar13 = i;
        if ((int)uVar16 < 0) {
LAB_002ccf40:
          *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
          goto LAB_002ccf4e;
        }
      }
      else {
        uVar16 = uVar6 & 0x3ff;
        if ((((uVar6 >> 0xc & 1) != 0) && ((bVar10 & 2) != 0)) &&
           ((uVar16 == 0x3a5 || (uVar16 == 0x399)))) {
          uVar6 = uVar6 | 0x8000;
        }
        uVar5 = uVar6 >> 0xd & 1;
        if (i < srcLength) {
          uVar14 = (ulong)i;
          do {
            uVar7 = getDiacriticData((uint)(ushort)src[uVar14]);
            uVar15 = uVar14;
            if (uVar7 == 0) break;
            uVar6 = uVar6 | uVar7;
            uVar5 = uVar5 + ((uVar7 >> 0xd & 1) != 0);
            uVar14 = uVar14 + 1;
            uVar15 = (ulong)(uint)srcLength;
          } while ((uint)srcLength != uVar14);
          i = (int)uVar15;
        }
        bVar10 = bVar18 + 2;
        if ((uVar6 & 0xd000) != 0x5000) {
          bVar10 = bVar18;
        }
        if (((uVar16 != 0x397) || ((uVar6 >> 0xe & 1) == 0)) ||
           ((uVar5 != 0 ||
            ((bVar1 || (UVar4 = isFollowedByCasedLetter(src,i,srcLength), UVar4 != '\0')))))) {
          bVar18 = true;
          bVar1 = false;
          if ((short)uVar6 < 0) {
            bVar1 = false;
            if (uVar16 == 0x3a5) {
              uVar16 = 0x3ab;
              uVar6 = 0;
            }
            else if (uVar16 == 0x399) {
              uVar16 = 0x3aa;
              uVar6 = 0;
              bVar1 = false;
            }
          }
        }
        else {
          bVar18 = i == iVar13;
          bVar1 = !bVar18;
          uVar16 = 0x397;
          if (bVar18) {
            uVar16 = 0x389;
          }
        }
        if ((options >> 0xe & 1) == 0 && edits == (Edits *)0x0) {
LAB_002cce48:
          if (destCapacity <= iVar8) {
            if (iVar8 != 0x7fffffff) goto LAB_002cce6d;
            goto LAB_002ccf40;
          }
          dest[iVar8] = (UChar)uVar16;
LAB_002cce6d:
          uVar16 = iVar8 + 1;
          uVar9 = (ulong)uVar16;
          if ((-2 < iVar8) && ((uVar6 & 0x18000) != 0)) {
            if ((int)uVar16 < destCapacity) {
              dest[uVar16] = L'̈';
            }
            else if (uVar16 == 0x7fffffff) goto LAB_002ccf40;
            uVar9 = (ulong)(iVar8 + 2);
          }
          iVar13 = (int)uVar9;
          if (!(bool)(bVar1 ^ 1) && -1 < iVar13) {
            if (iVar13 < destCapacity) {
              dest[uVar9] = L'́';
            }
            else if (iVar13 == 0x7fffffff) goto LAB_002ccf40;
            uVar9 = (ulong)(iVar13 + 1);
          }
          uVar16 = (uint)uVar9;
          if (((int)uVar16 < 0) || ((int)uVar5 < 1)) goto joined_r0x002ccc78;
          pUVar11 = dest + uVar9;
          uVar5 = uVar5 + 1;
          do {
            iVar13 = (int)uVar9;
            if (iVar13 < destCapacity) {
              *pUVar11 = L'Ι';
            }
            else if (iVar13 == 0x7fffffff) goto LAB_002ccf40;
            uVar9 = (ulong)(iVar13 + 1);
            pUVar11 = pUVar11 + 1;
            uVar5 = uVar5 - 1;
            iVar13 = i;
          } while (1 < uVar5);
        }
        else {
          bVar2 = 0 < (int)uVar5 || uVar16 != (ushort)src[iVar13];
          if ((uVar6 & 0x18000) != 0) {
            bVar17 = true;
            if (iVar12 < i) {
              bVar17 = src[iVar12] != L'̈';
            }
            bVar2 = (bool)(bVar2 | bVar17);
            iVar12 = iVar13 + 2;
          }
          if (!bVar18) {
            bVar18 = true;
            if (iVar12 < i) {
              bVar18 = src[iVar12] != L'́';
            }
            bVar2 = (bool)(bVar2 | bVar18);
            iVar12 = iVar12 + 1;
          }
          unchangedLength = i - iVar13;
          iVar13 = (iVar12 - iVar13) + uVar5;
          if ((bool)(unchangedLength != iVar13 | bVar2)) {
            if (edits != (Edits *)0x0) {
              Edits::addReplace(edits,unchangedLength,iVar13);
            }
            goto LAB_002cce48;
          }
          if (edits != (Edits *)0x0) {
            Edits::addUnchanged(edits,unchangedLength);
          }
          iVar13 = i;
          if ((options >> 0xe & 1) == 0) goto LAB_002cce48;
        }
      }
      iVar8 = (int32_t)uVar9;
      bVar1 = bVar3;
    } while (iVar13 < srcLength);
  }
  return iVar8;
}

Assistant:

int32_t toUpper(uint32_t options,
                UChar *dest, int32_t destCapacity,
                const UChar *src, int32_t srcLength,
                Edits *edits,
                UErrorCode &errorCode) {
    int32_t destIndex=0;
    uint32_t state = 0;
    for (int32_t i = 0; i < srcLength;) {
        int32_t nextIndex = i;
        UChar32 c;
        U16_NEXT(src, nextIndex, srcLength, c);
        uint32_t nextState = 0;
        int32_t type = ucase_getTypeOrIgnorable(c);
        if ((type & UCASE_IGNORABLE) != 0) {
            // c is case-ignorable
            nextState |= (state & AFTER_CASED);
        } else if (type != UCASE_NONE) {
            // c is cased
            nextState |= AFTER_CASED;
        }
        uint32_t data = getLetterData(c);
        if (data > 0) {
            uint32_t upper = data & UPPER_MASK;
            // Add a dialytika to this iota or ypsilon vowel
            // if we removed a tonos from the previous vowel,
            // and that previous vowel did not also have (or gain) a dialytika.
            // Adding one only to the final vowel in a longer sequence
            // (which does not occur in normal writing) would require lookahead.
            // Set the same flag as for preserving an existing dialytika.
            if ((data & HAS_VOWEL) != 0 && (state & AFTER_VOWEL_WITH_ACCENT) != 0 &&
                    (upper == 0x399 || upper == 0x3A5)) {
                data |= HAS_DIALYTIKA;
            }
            int32_t numYpogegrammeni = 0;  // Map each one to a trailing, spacing, capital iota.
            if ((data & HAS_YPOGEGRAMMENI) != 0) {
                numYpogegrammeni = 1;
            }
            // Skip combining diacritics after this Greek letter.
            while (nextIndex < srcLength) {
                uint32_t diacriticData = getDiacriticData(src[nextIndex]);
                if (diacriticData != 0) {
                    data |= diacriticData;
                    if ((diacriticData & HAS_YPOGEGRAMMENI) != 0) {
                        ++numYpogegrammeni;
                    }
                    ++nextIndex;
                } else {
                    break;  // not a Greek diacritic
                }
            }
            if ((data & HAS_VOWEL_AND_ACCENT_AND_DIALYTIKA) == HAS_VOWEL_AND_ACCENT) {
                nextState |= AFTER_VOWEL_WITH_ACCENT;
            }
            // Map according to Greek rules.
            UBool addTonos = FALSE;
            if (upper == 0x397 &&
                    (data & HAS_ACCENT) != 0 &&
                    numYpogegrammeni == 0 &&
                    (state & AFTER_CASED) == 0 &&
                    !isFollowedByCasedLetter(src, nextIndex, srcLength)) {
                // Keep disjunctive "or" with (only) a tonos.
                // We use the same "word boundary" conditions as for the Final_Sigma test.
                if (i == nextIndex) {
                    upper = 0x389;  // Preserve the precomposed form.
                } else {
                    addTonos = TRUE;
                }
            } else if ((data & HAS_DIALYTIKA) != 0) {
                // Preserve a vowel with dialytika in precomposed form if it exists.
                if (upper == 0x399) {
                    upper = 0x3AA;
                    data &= ~HAS_EITHER_DIALYTIKA;
                } else if (upper == 0x3A5) {
                    upper = 0x3AB;
                    data &= ~HAS_EITHER_DIALYTIKA;
                }
            }

            UBool change;
            if (edits == nullptr && (options & U_OMIT_UNCHANGED_TEXT) == 0) {
                change = TRUE;  // common, simple usage
            } else {
                // Find out first whether we are changing the text.
                change = src[i] != upper || numYpogegrammeni > 0;
                int32_t i2 = i + 1;
                if ((data & HAS_EITHER_DIALYTIKA) != 0) {
                    change |= i2 >= nextIndex || src[i2] != 0x308;
                    ++i2;
                }
                if (addTonos) {
                    change |= i2 >= nextIndex || src[i2] != 0x301;
                    ++i2;
                }
                int32_t oldLength = nextIndex - i;
                int32_t newLength = (i2 - i) + numYpogegrammeni;
                change |= oldLength != newLength;
                if (change) {
                    if (edits != NULL) {
                        edits->addReplace(oldLength, newLength);
                    }
                } else {
                    if (edits != NULL) {
                        edits->addUnchanged(oldLength);
                    }
                    // Write unchanged text?
                    change = (options & U_OMIT_UNCHANGED_TEXT) == 0;
                }
            }

            if (change) {
                destIndex=appendUChar(dest, destIndex, destCapacity, (UChar)upper);
                if (destIndex >= 0 && (data & HAS_EITHER_DIALYTIKA) != 0) {
                    destIndex=appendUChar(dest, destIndex, destCapacity, 0x308);  // restore or add a dialytika
                }
                if (destIndex >= 0 && addTonos) {
                    destIndex=appendUChar(dest, destIndex, destCapacity, 0x301);
                }
                while (destIndex >= 0 && numYpogegrammeni > 0) {
                    destIndex=appendUChar(dest, destIndex, destCapacity, 0x399);
                    --numYpogegrammeni;
                }
                if(destIndex<0) {
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }
            }
        } else {
            const UChar *s;
            c=ucase_toFullUpper(c, NULL, NULL, &s, UCASE_LOC_GREEK);
            destIndex = appendResult(dest, destIndex, destCapacity, c, s,
                                     nextIndex - i, options, edits);
            if (destIndex < 0) {
                errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }
        }
        i = nextIndex;
        state = nextState;
    }

    return destIndex;
}